

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
absl::container_internal::
btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
::transfer_n(btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
             *this,size_type n,size_type dest_i,size_type src_i,
            btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
            *src_node,allocator_type *alloc)

{
  CopyConst<char,_ElementType<3UL>_> *pCVar1;
  CopyConst<char,_ElementType<3UL>_> *pCVar2;
  long lVar3;
  int iVar4;
  int local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_58 = 1;
  uStack_50 = 0;
  uStack_48 = 4;
  uStack_40 = 0x1e;
  local_38 = 0x1f;
  pCVar1 = internal_layout::
           LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>*,unsigned_int,unsigned_char,std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>*>,absl::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul>,absl::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul>>
           ::Pointer<3ul,char>((LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>*,unsigned_int,unsigned_char,std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>*>,absl::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul>,absl::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul>>
                                *)&local_58,(char *)src_node);
  local_58 = 1;
  uStack_50 = 0;
  uStack_48 = 4;
  uStack_40 = 0x1e;
  local_38 = 0x1f;
  pCVar2 = internal_layout::
           LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>*,unsigned_int,unsigned_char,std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>*>,absl::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul>,absl::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul>>
           ::Pointer<3ul,char>((LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>*,unsigned_int,unsigned_char,std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>*>,absl::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul>,absl::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul>>
                                *)&local_58,(char *)this);
  if (n != 0) {
    iVar4 = (int)src_i;
    local_60 = (int)dest_i;
    lVar3 = 0;
    do {
      *(undefined8 *)
       ((long)&pCVar2[local_60]._M_t.super___uniq_ptr_impl<SeqEntry,_std::default_delete<SeqEntry>_>
               ._M_t.super__Tuple_impl<0UL,_SeqEntry_*,_std::default_delete<SeqEntry>_>.
               super__Head_base<0UL,_SeqEntry_*,_false>._M_head_impl + lVar3) =
           *(undefined8 *)
            ((long)&pCVar1[iVar4]._M_t.
                    super___uniq_ptr_impl<SeqEntry,_std::default_delete<SeqEntry>_>._M_t.
                    super__Tuple_impl<0UL,_SeqEntry_*,_std::default_delete<SeqEntry>_>.
                    super__Head_base<0UL,_SeqEntry_*,_false>._M_head_impl + lVar3);
      *(undefined8 *)
       ((long)&pCVar1[iVar4]._M_t.super___uniq_ptr_impl<SeqEntry,_std::default_delete<SeqEntry>_>.
               _M_t.super__Tuple_impl<0UL,_SeqEntry_*,_std::default_delete<SeqEntry>_>.
               super__Head_base<0UL,_SeqEntry_*,_false>._M_head_impl + lVar3) = 0;
      std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>::~unique_ptr
                ((unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_> *)
                 ((long)&pCVar1[iVar4]._M_t.
                         super___uniq_ptr_impl<SeqEntry,_std::default_delete<SeqEntry>_>._M_t.
                         super__Tuple_impl<0UL,_SeqEntry_*,_std::default_delete<SeqEntry>_>.
                         super__Head_base<0UL,_SeqEntry_*,_false>._M_head_impl + lVar3));
      lVar3 = lVar3 + 8;
    } while (n << 3 != lVar3);
  }
  return;
}

Assistant:

void transfer_n(const size_type n, const size_type dest_i,
                  const size_type src_i, btree_node *src_node,
                  allocator_type *alloc) {
    next_generation();
    for (slot_type *src = src_node->slot(src_i), *end = src + n,
                   *dest = slot(dest_i);
         src != end; ++src, ++dest) {
      transfer(dest, src, alloc);
    }
  }